

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O3

Symbol * ehf_findsymbol(GlobalVars *gv,Section *sec,char *name)

{
  Symbol **ppSVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  Symbol *pSVar5;
  Symbol *pSVar6;
  
  do {
    ppSVar1 = gv->symbols;
    uVar4 = elf_hash(name);
    pSVar5 = ppSVar1[uVar4 & 0xffff];
    bVar2 = true;
    if (pSVar5 == (Symbol *)0x0) {
      pSVar5 = (Symbol *)0x0;
      pSVar6 = (Symbol *)0x0;
    }
    else {
      pSVar6 = (Symbol *)0x0;
      do {
        iVar3 = strcmp(name,pSVar5->name);
        if (iVar3 == 0) {
          if (pSVar6 == (Symbol *)0x0) {
            pSVar6 = pSVar5;
          }
          if (((sec == (Section *)0x0) || (pSVar5->type != '\x02')) ||
             (((pSVar5->relsect->flags ^ sec->flags) & 0x20) == 0)) {
            bVar2 = false;
            goto LAB_00116a62;
          }
        }
        pSVar5 = pSVar5->glob_chain;
      } while (pSVar5 != (Symbol *)0x0);
      pSVar5 = (Symbol *)0x0;
    }
LAB_00116a62:
    if (pSVar6 == (Symbol *)0x0) {
      pSVar6 = pSVar5;
    }
    if (!bVar2) {
      pSVar6 = pSVar5;
    }
    if ((pSVar6 == (Symbol *)0x0) || (pSVar6->type != '\x04')) {
      return pSVar6;
    }
    name = pSVar6->indir_name;
  } while( true );
}

Assistant:

static struct Symbol *ehf_findsymbol(struct GlobalVars *gv,
                                     struct Section *sec,const char *name)
{
  struct Symbol *sym = gv->symbols[elf_hash(name)%SYMHTABSIZE];
  struct Symbol *second_choice = NULL;

  while (sym) {
    if (!strcmp(name,sym->name)) {
      if (second_choice == NULL)
        second_choice = sym;

      if (sec!=NULL && sym->type==SYM_RELOC) {
        /* we prefer symbols from a section which has the same CPU-flags
           as the caller's section */
        if ((sec->flags & SF_EHFPPC) == (sym->relsect->flags & SF_EHFPPC))
          break;
      }
      else
        break;
    }
    sym = sym->glob_chain;
  }

  /* accept symbol from a section for a different CPU, if it's the only one */
  if (!sym && second_choice)
    sym = second_choice;

  if (sym)
    if (sym->type == SYM_INDIR)
      return ehf_findsymbol(gv,sec,sym->indir_name);

  return sym;
}